

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bws.c
# Opt level: O3

int nn_bws_create(nn_ep *ep)

{
  int iVar1;
  int iVar2;
  nn_bws *self;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  nn_ctx *ctx;
  nn_usock *self_00;
  int ipv4only;
  int ipv4only_1;
  size_t ipv4onlylen;
  size_t sslen;
  sockaddr_storage ss;
  int local_160;
  int local_15c;
  size_t local_158;
  size_t local_150;
  size_t local_148;
  size_t local_140;
  sockaddr_storage local_138;
  sockaddr_storage local_b0;
  
  self = (nn_bws *)nn_alloc_(0x2e0);
  if (self == (nn_bws *)0x0) {
    nn_bws_create_cold_5();
LAB_00159403:
    nn_bws_create_cold_1();
LAB_00159408:
    nn_bws_create_cold_4();
  }
  else {
    self->ep = ep;
    nn_ep_tran_setup(ep,&nn_bws_ep_ops,self);
    pcVar3 = nn_ep_getaddr(ep);
    pcVar4 = strrchr(pcVar3,0x3a);
    if (pcVar4 == (char *)0x0) {
      return -0x16;
    }
    sVar5 = strlen(pcVar3);
    pcVar4 = pcVar4 + 1;
    iVar1 = nn_port_resolve(pcVar4,(size_t)(pcVar3 + (sVar5 - (long)pcVar4)));
    if (iVar1 < 0) {
      return -0x16;
    }
    local_150 = 4;
    nn_ep_getopt(ep,0,0xe,&local_160,&local_150);
    if (local_150 != 4) goto LAB_00159403;
    iVar1 = nn_iface_resolve(pcVar3,(size_t)(pcVar4 + ~(ulong)pcVar3),local_160,&local_b0,&local_148
                            );
    if (iVar1 < 0) {
      return -0x13;
    }
    ctx = nn_ep_getctx(ep);
    nn_fsm_init_root((nn_fsm *)self,nn_bws_handler,nn_bws_shutdown,ctx);
    self->state = 1;
    self->aws = (nn_aws *)0x0;
    nn_list_init(&self->awss);
    nn_fsm_start((nn_fsm *)self);
    self_00 = &self->usock;
    nn_usock_init(self_00,1,(nn_fsm *)self);
    pcVar3 = nn_ep_getaddr(self->ep);
    local_138.ss_family = 0;
    local_138.__ss_padding[0] = '\0';
    local_138.__ss_padding[1] = '\0';
    local_138.__ss_padding[2] = '\0';
    local_138.__ss_padding[3] = '\0';
    local_138.__ss_padding[4] = '\0';
    local_138.__ss_padding[5] = '\0';
    local_138.__ss_padding[6] = '\0';
    local_138.__ss_padding[7] = '\0';
    local_138.__ss_padding[8] = '\0';
    local_138.__ss_padding[9] = '\0';
    local_138.__ss_padding[10] = '\0';
    local_138.__ss_padding[0xb] = '\0';
    local_138.__ss_padding[0xc] = '\0';
    local_138.__ss_padding[0xd] = '\0';
    local_138.__ss_padding[0xe] = '\0';
    local_138.__ss_padding[0xf] = '\0';
    local_138.__ss_padding[0x10] = '\0';
    local_138.__ss_padding[0x11] = '\0';
    local_138.__ss_padding[0x12] = '\0';
    local_138.__ss_padding[0x13] = '\0';
    local_138.__ss_padding[0x14] = '\0';
    local_138.__ss_padding[0x15] = '\0';
    local_138.__ss_padding[0x16] = '\0';
    local_138.__ss_padding[0x17] = '\0';
    local_138.__ss_padding[0x18] = '\0';
    local_138.__ss_padding[0x19] = '\0';
    local_138.__ss_padding[0x1a] = '\0';
    local_138.__ss_padding[0x1b] = '\0';
    local_138.__ss_padding[0x1c] = '\0';
    local_138.__ss_padding[0x1d] = '\0';
    local_138.__ss_padding[0x1e] = '\0';
    local_138.__ss_padding[0x1f] = '\0';
    local_138.__ss_padding[0x20] = '\0';
    local_138.__ss_padding[0x21] = '\0';
    local_138.__ss_padding[0x22] = '\0';
    local_138.__ss_padding[0x23] = '\0';
    local_138.__ss_padding[0x24] = '\0';
    local_138.__ss_padding[0x25] = '\0';
    local_138.__ss_padding[0x26] = '\0';
    local_138.__ss_padding[0x27] = '\0';
    local_138.__ss_padding[0x28] = '\0';
    local_138.__ss_padding[0x29] = '\0';
    local_138.__ss_padding[0x2a] = '\0';
    local_138.__ss_padding[0x2b] = '\0';
    local_138.__ss_padding[0x2c] = '\0';
    local_138.__ss_padding[0x2d] = '\0';
    local_138.__ss_padding[0x2e] = '\0';
    local_138.__ss_padding[0x2f] = '\0';
    local_138.__ss_padding[0x30] = '\0';
    local_138.__ss_padding[0x31] = '\0';
    local_138.__ss_padding[0x32] = '\0';
    local_138.__ss_padding[0x33] = '\0';
    local_138.__ss_padding[0x34] = '\0';
    local_138.__ss_padding[0x35] = '\0';
    local_138.__ss_padding[0x36] = '\0';
    local_138.__ss_padding[0x37] = '\0';
    local_138.__ss_padding[0x38] = '\0';
    local_138.__ss_padding[0x39] = '\0';
    local_138.__ss_padding[0x3a] = '\0';
    local_138.__ss_padding[0x3b] = '\0';
    local_138.__ss_padding[0x3c] = '\0';
    local_138.__ss_padding[0x3d] = '\0';
    local_138.__ss_padding[0x3e] = '\0';
    local_138.__ss_padding[0x3f] = '\0';
    local_138.__ss_padding[0x40] = '\0';
    local_138.__ss_padding[0x41] = '\0';
    local_138.__ss_padding[0x42] = '\0';
    local_138.__ss_padding[0x43] = '\0';
    local_138.__ss_padding[0x44] = '\0';
    local_138.__ss_padding[0x45] = '\0';
    local_138.__ss_padding[0x46] = '\0';
    local_138.__ss_padding[0x47] = '\0';
    local_138.__ss_padding[0x48] = '\0';
    local_138.__ss_padding[0x49] = '\0';
    local_138.__ss_padding[0x4a] = '\0';
    local_138.__ss_padding[0x4b] = '\0';
    local_138.__ss_padding[0x4c] = '\0';
    local_138.__ss_padding[0x4d] = '\0';
    local_138.__ss_padding[0x4e] = '\0';
    local_138.__ss_padding[0x4f] = '\0';
    local_138.__ss_padding[0x50] = '\0';
    local_138.__ss_padding[0x51] = '\0';
    local_138.__ss_padding[0x52] = '\0';
    local_138.__ss_padding[0x53] = '\0';
    local_138.__ss_padding[0x54] = '\0';
    local_138.__ss_padding[0x55] = '\0';
    local_138.__ss_padding[0x56] = '\0';
    local_138.__ss_padding[0x57] = '\0';
    local_138.__ss_padding[0x58] = '\0';
    local_138.__ss_padding[0x59] = '\0';
    local_138.__ss_padding[0x5a] = '\0';
    local_138.__ss_padding[0x5b] = '\0';
    local_138.__ss_padding[0x5c] = '\0';
    local_138.__ss_padding[0x5d] = '\0';
    local_138.__ss_padding[0x5e] = '\0';
    local_138.__ss_padding[0x5f] = '\0';
    local_138.__ss_padding[0x60] = '\0';
    local_138.__ss_padding[0x61] = '\0';
    local_138.__ss_padding[0x62] = '\0';
    local_138.__ss_padding[99] = '\0';
    local_138.__ss_padding[100] = '\0';
    local_138.__ss_padding[0x65] = '\0';
    local_138.__ss_padding[0x66] = '\0';
    local_138.__ss_padding[0x67] = '\0';
    local_138.__ss_padding[0x68] = '\0';
    local_138.__ss_padding[0x69] = '\0';
    local_138.__ss_padding[0x6a] = '\0';
    local_138.__ss_padding[0x6b] = '\0';
    local_138.__ss_padding[0x6c] = '\0';
    local_138.__ss_padding[0x6d] = '\0';
    local_138.__ss_padding[0x6e] = '\0';
    local_138.__ss_padding[0x6f] = '\0';
    local_138.__ss_padding[0x70] = '\0';
    local_138.__ss_padding[0x71] = '\0';
    local_138.__ss_padding[0x72] = '\0';
    local_138.__ss_padding[0x73] = '\0';
    local_138.__ss_padding[0x74] = '\0';
    local_138.__ss_padding[0x75] = '\0';
    local_138.__ss_align = 0;
    pcVar4 = strrchr(pcVar3,0x3a);
    if (pcVar4 == (char *)0x0) goto LAB_00159408;
    sVar5 = strlen(pcVar3);
    pcVar4 = pcVar4 + 1;
    iVar1 = nn_port_resolve(pcVar4,(size_t)(pcVar3 + (sVar5 - (long)pcVar4)));
    if (iVar1 < 0) {
      return iVar1;
    }
    local_140 = 4;
    nn_ep_getopt(self->ep,0,0xe,&local_15c,&local_140);
    if (local_140 == 4) {
      iVar2 = nn_iface_resolve(pcVar3,(size_t)(pcVar4 + ~(ulong)pcVar3),local_15c,&local_138,
                               &local_158);
      if (iVar2 < 0) {
        return iVar2;
      }
      local_158 = 0x10;
      if (local_138.ss_family == 2) {
LAB_00159381:
        local_138.__ss_padding._0_2_ = (ushort)iVar1 << 8 | (ushort)iVar1 >> 8;
        iVar1 = nn_usock_start(self_00,(uint)local_138.ss_family,1,0);
        if (iVar1 < 0) {
          return iVar1;
        }
        iVar1 = nn_usock_bind(self_00,(sockaddr *)&local_138,local_158);
        if ((-1 < iVar1) && (iVar1 = nn_usock_listen(self_00,100), -1 < iVar1)) {
          nn_bws_start_accepting(self);
          return 0;
        }
        nn_usock_stop(self_00);
        return iVar1;
      }
      if (local_138.ss_family == 10) {
        local_158 = 0x1c;
        goto LAB_00159381;
      }
      goto LAB_00159412;
    }
  }
  nn_bws_create_cold_2();
LAB_00159412:
  nn_bws_create_cold_3();
}

Assistant:

int nn_bws_create (struct nn_ep *ep)
{
    int rc;
    struct nn_bws *self;
    const char *addr;
    const char *end;
    const char *pos;
    struct sockaddr_storage ss;
    size_t sslen;
    int ipv4only;
    size_t ipv4onlylen;

    /*  Allocate the new endpoint object. */
    self = nn_alloc (sizeof (struct nn_bws), "bws");
    alloc_assert (self);
    self->ep = ep;

    nn_ep_tran_setup (ep, &nn_bws_ep_ops, self);
    addr = nn_ep_getaddr (ep);

    /*  Parse the port. */
    end = addr + strlen (addr);
    pos = strrchr (addr, ':');
    if (!pos) {
        return -EINVAL;
    }
    ++pos;
    rc = nn_port_resolve (pos, end - pos);
    if (rc < 0) {
        return -EINVAL;
    }

    /*  Check whether IPv6 is to be used. */
    ipv4onlylen = sizeof (ipv4only);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_IPV4ONLY, &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));

    /*  Parse the address. */
    rc = nn_iface_resolve (addr, pos - addr - 1, ipv4only, &ss, &sslen);
    if (rc < 0) {
        return -ENODEV;
    }

    /*  Initialise the structure. */
    nn_fsm_init_root (&self->fsm, nn_bws_handler, nn_bws_shutdown,
        nn_ep_getctx (ep));
    self->state = NN_BWS_STATE_IDLE;
    self->aws = NULL;
    nn_list_init (&self->awss);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    nn_usock_init (&self->usock, NN_BWS_SRC_USOCK, &self->fsm);

    rc = nn_bws_listen (self);
    if (rc != 0) {
        return rc;
    }

    return 0;
}